

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall llvm::raw_fd_ostream::~raw_fd_ostream(raw_fd_ostream *this)

{
  bool bVar1;
  error_code eVar2;
  error_code local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 local_30;
  undefined1 local_28 [12];
  undefined4 uStack_1c;
  error_code EC;
  raw_fd_ostream *this_local;
  
  *(undefined ***)this = &PTR__raw_fd_ostream_003799a8;
  EC._M_cat = (error_category *)this;
  if ((-1 < this->FD) && (raw_ostream::flush((raw_ostream *)this), (this->ShouldClose & 1U) != 0)) {
    eVar2 = sys::Process::SafelyCloseFileDescriptor(this->FD);
    EC._0_8_ = eVar2._M_cat;
    local_28._8_4_ = eVar2._M_value;
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_28 + 8));
    if (bVar1) {
      local_30 = CONCAT44(uStack_1c,local_28._8_4_);
      local_28._0_8_ = EC._0_8_;
      eVar2._4_4_ = 0;
      eVar2._M_value = local_28._8_4_;
      eVar2._M_cat = (error_category *)EC._0_8_;
      error_detected(this,eVar2);
    }
  }
  bVar1 = has_error(this);
  if (bVar1) {
    eVar2 = error(this);
    local_80._M_cat = eVar2._M_cat;
    local_80._M_value = eVar2._M_value;
    std::error_code::message_abi_cxx11_(&local_70,&local_80);
    std::operator+(&local_50,"IO failure on output stream: ",&local_70);
    report_fatal_error(&local_50,false);
  }
  raw_pwrite_stream::~raw_pwrite_stream((raw_pwrite_stream *)this);
  return;
}

Assistant:

raw_fd_ostream::~raw_fd_ostream() {
  if (FD >= 0) {
    flush();
    if (ShouldClose) {
      if (auto EC = sys::Process::SafelyCloseFileDescriptor(FD))
        error_detected(EC);
    }
  }

#ifdef __MINGW32__
  // On mingw, global dtors should not call exit().
  // report_fatal_error() invokes exit(). We know report_fatal_error()
  // might not write messages to stderr when any errors were detected
  // on FD == 2.
  if (FD == 2) return;
#endif

  // If there are any pending errors, report them now. Clients wishing
  // to avoid report_fatal_error calls should check for errors with
  // has_error() and clear the error flag with clear_error() before
  // destructing raw_ostream objects which may have errors.
  if (has_error())
    report_fatal_error("IO failure on output stream: " + error().message(),
                       /*GenCrashDiag=*/false);
}